

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O2

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::validateSignalEventOwnership
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hSignalEvent)

{
  iterator iVar1;
  iterator iVar2;
  ostream *poVar3;
  string previousActionOwner;
  ze_event_handle_t local_38;
  string local_30 [32];
  
  local_38 = hSignalEvent;
  iVar1 = std::
          _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->eventToDagID)._M_h,&local_38);
  if ((iVar1.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>.
       _M_cur != (__node_type *)0x0) &&
     (*(int *)((long)iVar1.
                     super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                     ._M_cur + 0x10) != -1)) {
    iVar2 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->dagIDToAction)._M_h,
                   (key_type_conflict *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                          ._M_cur + 0x10));
    if (iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      std::__cxx11::string::string
                (local_30,(string *)
                          ((long)iVar2.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
                                 ._M_cur + 0x10));
      poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: ");
      poVar3 = std::operator<<(poVar3,(string *)zeCallDisc);
      poVar3 = std::operator<<(poVar3," is using the same ze_event_handle_t for signal {");
      poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
      poVar3 = std::operator<<(poVar3,"} which has been previously used by: ");
      poVar3 = std::operator<<(poVar3,local_30);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string(local_30);
    }
  }
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::validateSignalEventOwnership(const std::string &zeCallDisc,
                                                                  const ze_event_handle_t hSignalEvent) {
    const auto it = eventToDagID.find(hSignalEvent);
    if (it != eventToDagID.end() && it->second != invalidDagID) {
        const auto actionIt = dagIDToAction.find(it->second);
        if (actionIt != dagIDToAction.end()) {
            const std::string previousActionOwner = actionIt->second.first;
            std::cerr << "Warning: " << zeCallDisc << " is using the same ze_event_handle_t for signal {" << hSignalEvent << "} which has been previously used by: " << previousActionOwner << std::endl;
        }
    }
}